

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O3

void __thiscall sf::priv::GlContext::initialize(GlContext *this,ContextSettings *requestedSettings)

{
  uint *major;
  uint *minor;
  Uint32 *pUVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  GlFunctionPointer p_Var5;
  GlFunctionPointer p_Var6;
  GlFunctionPointer p_Var7;
  GlFunctionPointer p_Var8;
  char *pcVar9;
  ostream *poVar10;
  size_t sVar11;
  undefined4 in_ECX;
  int iVar12;
  uint uVar13;
  ContextSettings *pCVar14;
  undefined1 auVar15 [16];
  int numExtensions;
  int minorVersion;
  int majorVersion;
  int flags;
  uint local_54;
  uint local_50;
  uint local_4c;
  ContextSettings *local_48;
  GlFunctionPointer local_40;
  uint local_34;
  
  setActive(this,true);
  local_4c = 0;
  local_50 = 0;
  p_Var5 = getFunction("glGetIntegerv");
  p_Var6 = getFunction("glGetError");
  p_Var7 = getFunction("glGetString");
  p_Var8 = getFunction("glEnable");
  local_40 = getFunction("glIsEnabled");
  auVar15._0_4_ = -(uint)((int)((ulong)p_Var5 >> 0x20) == 0 && (int)p_Var5 == 0);
  auVar15._4_4_ = -(uint)((int)p_Var6 == 0 && (int)((ulong)p_Var6 >> 0x20) == 0);
  auVar15._8_4_ = -(uint)((int)((ulong)p_Var7 >> 0x20) == 0 && (int)p_Var7 == 0);
  auVar15._12_4_ = -(uint)((int)p_Var8 == 0 && (int)((ulong)p_Var8 >> 0x20) == 0);
  iVar12 = movmskps(in_ECX,auVar15);
  if (iVar12 != 0 || local_40 == (GlFunctionPointer)0x0) {
    poVar10 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Could not load necessary function to initialize OpenGL context",0x3e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    return;
  }
  (*p_Var5)(0x821b,&local_4c);
  (*p_Var5)(0x821c,&local_50);
  iVar12 = (*p_Var6)();
  local_48 = requestedSettings;
  if (iVar12 == 0x500) {
    (this->m_settings).majorVersion = 1;
    (this->m_settings).minorVersion = 1;
    pcVar9 = (char *)(*p_Var7)(0x1f02);
    if (pcVar9 == (char *)0x0) {
      poVar10 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"Unable to retrieve OpenGL version string, defaulting to 1.1",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    else {
      major = &(this->m_settings).majorVersion;
      minor = &(this->m_settings).minorVersion;
      bVar3 = anon_unknown.dwarf_3d74ed::GlContextImpl::parseVersionString
                        (pcVar9,"OpenGL ES-CL ",major,minor);
      if ((((!bVar3) &&
           (bVar3 = anon_unknown.dwarf_3d74ed::GlContextImpl::parseVersionString
                              (pcVar9,"OpenGL ES-CM ",major,minor), !bVar3)) &&
          (bVar3 = anon_unknown.dwarf_3d74ed::GlContextImpl::parseVersionString
                             (pcVar9,"OpenGL ES ",major,minor), !bVar3)) &&
         (bVar3 = anon_unknown.dwarf_3d74ed::GlContextImpl::parseVersionString
                            (pcVar9,"",major,minor), !bVar3)) {
        poVar10 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"Unable to parse OpenGL version string: \"",0x28);
        sVar11 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\", defaulting to 1.1",0x14);
        std::endl<char,std::char_traits<char>>(poVar10);
      }
    }
  }
  else {
    (this->m_settings).majorVersion = local_4c;
    (this->m_settings).minorVersion = local_50;
  }
  pCVar14 = local_48;
  (this->m_settings).attributeFlags = 0;
  if (2 < (this->m_settings).majorVersion) {
    local_34 = 0;
    (*p_Var5)(0x821e,&local_34);
    if ((local_34 & 2) != 0) {
      pUVar1 = &(this->m_settings).attributeFlags;
      *(byte *)pUVar1 = (byte)*pUVar1 | 4;
    }
    uVar13 = (this->m_settings).majorVersion;
    uVar2 = (this->m_settings).minorVersion;
    if (uVar2 == 1 && uVar13 == 3) {
      pUVar1 = &(this->m_settings).attributeFlags;
      *(byte *)pUVar1 = (byte)*pUVar1 | 1;
      p_Var6 = getFunction("glGetStringi");
      if (p_Var6 != (GlFunctionPointer)0x0) {
        local_54 = 0;
        (*p_Var5)(0x821d,&local_54);
        pCVar14 = local_48;
        if (local_54 != 0) {
          uVar13 = 0;
          do {
            pcVar9 = (char *)(*p_Var6)(0x1f03,(ulong)uVar13);
            pcVar9 = strstr(pcVar9,"GL_ARB_compatibility");
            pCVar14 = local_48;
            if (pcVar9 != (char *)0x0) {
              pUVar1 = &(this->m_settings).attributeFlags;
              *(byte *)pUVar1 = (byte)*pUVar1 & 0xfe;
              break;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < local_54);
        }
      }
    }
    else if (1 < uVar2 || 3 < uVar13) {
      local_54 = 0;
      (*p_Var5)(0x9126,&local_54);
      if ((local_54 & 1) != 0) {
        pUVar1 = &(this->m_settings).attributeFlags;
        *(byte *)pUVar1 = (byte)*pUVar1 | 1;
      }
    }
  }
  if ((pCVar14->antialiasingLevel == 0) || ((this->m_settings).antialiasingLevel == 0)) {
    (this->m_settings).antialiasingLevel = 0;
  }
  else {
    (*p_Var8)(0x809d);
  }
  if ((pCVar14->sRgbCapable == true) && ((this->m_settings).sRgbCapable == true)) {
    (*p_Var8)(0x8db9);
    cVar4 = (*local_40)(0x8db9);
    if (cVar4 != '\0') {
      return;
    }
    poVar10 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Warning: Failed to enable GL_FRAMEBUFFER_SRGB",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  (this->m_settings).sRgbCapable = false;
  return;
}

Assistant:

void GlContext::initialize(const ContextSettings& requestedSettings)
{
    // Activate the context
    setActive(true);

    // Retrieve the context version number
    int majorVersion = 0;
    int minorVersion = 0;

    // Try the new way first
    glGetIntegervFuncType glGetIntegervFunc = reinterpret_cast<glGetIntegervFuncType>(getFunction("glGetIntegerv"));
    glGetErrorFuncType glGetErrorFunc = reinterpret_cast<glGetErrorFuncType>(getFunction("glGetError"));
    glGetStringFuncType glGetStringFunc = reinterpret_cast<glGetStringFuncType>(getFunction("glGetString"));
    glEnableFuncType glEnableFunc = reinterpret_cast<glEnableFuncType>(getFunction("glEnable"));
    glIsEnabledFuncType glIsEnabledFunc = reinterpret_cast<glIsEnabledFuncType>(getFunction("glIsEnabled"));

    if (!glGetIntegervFunc || !glGetErrorFunc || !glGetStringFunc || !glEnableFunc || !glIsEnabledFunc)
    {
        err() << "Could not load necessary function to initialize OpenGL context" << std::endl;
        return;
    }

    glGetIntegervFunc(GL_MAJOR_VERSION, &majorVersion);
    glGetIntegervFunc(GL_MINOR_VERSION, &minorVersion);

    if (glGetErrorFunc() != GL_INVALID_ENUM)
    {
        m_settings.majorVersion = static_cast<unsigned int>(majorVersion);
        m_settings.minorVersion = static_cast<unsigned int>(minorVersion);
    }
    else
    {
        // Try the old way

        // If we can't get the version number, assume 1.1
        m_settings.majorVersion = 1;
        m_settings.minorVersion = 1;

        const char* version = reinterpret_cast<const char*>(glGetStringFunc(GL_VERSION));
        if (version)
        {
            // OpenGL ES Common Lite profile: The beginning of the returned string is "OpenGL ES-CL major.minor"
            // OpenGL ES Common profile:      The beginning of the returned string is "OpenGL ES-CM major.minor"
            // OpenGL ES Full profile:        The beginning of the returned string is "OpenGL ES major.minor"
            // Desktop OpenGL:                The beginning of the returned string is "major.minor"

            using GlContextImpl::parseVersionString;

            if (!parseVersionString(version, "OpenGL ES-CL ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES-CM ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES ",    m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "",              m_settings.majorVersion, m_settings.minorVersion))
            {
                err() << "Unable to parse OpenGL version string: \"" << version << "\", defaulting to 1.1" << std::endl;
            }
        }
        else
        {
            err() << "Unable to retrieve OpenGL version string, defaulting to 1.1" << std::endl;
        }
    }

    // 3.0 contexts only deprecate features, but do not remove them yet
    // 3.1 contexts remove features if ARB_compatibility is not present
    // 3.2+ contexts remove features only if a core profile is requested

    // If the context was created with wglCreateContext, it is guaranteed to be compatibility.
    // If a 3.0 context was created with wglCreateContextAttribsARB, it is guaranteed to be compatibility.
    // If a 3.1 context was created with wglCreateContextAttribsARB, the compatibility flag
    // is set only if ARB_compatibility is present
    // If a 3.2+ context was created with wglCreateContextAttribsARB, the compatibility flag
    // would have been set correctly already depending on whether ARB_create_context_profile is supported.

    // If the user requests a 3.0 context, it will be a compatibility context regardless of the requested profile.
    // If the user requests a 3.1 context and its creation was successful, the specification
    // states that it will not be a compatibility profile context regardless of the requested
    // profile unless ARB_compatibility is present.

    m_settings.attributeFlags = ContextSettings::Default;

    if (m_settings.majorVersion >= 3)
    {
        // Retrieve the context flags
        int flags = 0;
        glGetIntegervFunc(GL_CONTEXT_FLAGS, &flags);

        if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
            m_settings.attributeFlags |= ContextSettings::Debug;

        if ((m_settings.majorVersion == 3) && (m_settings.minorVersion == 1))
        {
            m_settings.attributeFlags |= ContextSettings::Core;

            glGetStringiFuncType glGetStringiFunc = reinterpret_cast<glGetStringiFuncType>(getFunction("glGetStringi"));

            if (glGetStringiFunc)
            {
                int numExtensions = 0;
                glGetIntegervFunc(GL_NUM_EXTENSIONS, &numExtensions);

                for (unsigned int i = 0; i < static_cast<unsigned int>(numExtensions); ++i)
                {
                    const char* extensionString = reinterpret_cast<const char*>(glGetStringiFunc(GL_EXTENSIONS, i));

                    if (std::strstr(extensionString, "GL_ARB_compatibility"))
                    {
                        m_settings.attributeFlags &= ~static_cast<Uint32>(ContextSettings::Core);
                        break;
                    }
                }
            }
        }
        else if ((m_settings.majorVersion > 3) || (m_settings.minorVersion >= 2))
        {
            // Retrieve the context profile
            int profile = 0;
            glGetIntegervFunc(GL_CONTEXT_PROFILE_MASK, &profile);

            if (profile & GL_CONTEXT_CORE_PROFILE_BIT)
                m_settings.attributeFlags |= ContextSettings::Core;
        }
    }

    // Enable anti-aliasing if requested by the user and supported
    if ((requestedSettings.antialiasingLevel > 0) && (m_settings.antialiasingLevel > 0))
    {
        glEnableFunc(GL_MULTISAMPLE);
    }
    else
    {
        m_settings.antialiasingLevel = 0;
    }

    // Enable sRGB if requested by the user and supported
    if (requestedSettings.sRgbCapable && m_settings.sRgbCapable)
    {
        glEnableFunc(GL_FRAMEBUFFER_SRGB);

        // Check to see if the enable was successful
        if (glIsEnabledFunc(GL_FRAMEBUFFER_SRGB) == GL_FALSE)
        {
            err() << "Warning: Failed to enable GL_FRAMEBUFFER_SRGB" << std::endl;
            m_settings.sRgbCapable = false;
        }
    }
    else
    {
        m_settings.sRgbCapable = false;
    }
}